

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationZ<std::complex<double>_>::matrix(RotationZ<std::complex<double>_> *this)

{
  complex<double> m10;
  complex<double> m11;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  data_type extraout_RDX_00;
  QRotationGate1<std::complex<double>_> *in_RSI;
  undefined8 in_R8;
  double in_XMM0_Qa;
  double __x;
  double dVar2;
  double __x_00;
  double __i;
  SquareMatrix<std::complex<double>_> SVar3;
  complex<double> m00;
  complex<double> m01;
  undefined8 in_stack_ffffffffffffff78;
  QRotationGate1<std::complex<double>_> *this_00;
  complex<double> local_58;
  complex<double> local_48;
  complex<double> local_38;
  complex<double> local_28;
  RotationZ<std::complex<double>_> *this_local;
  
  this_00 = in_RSI;
  this_local = this;
  __x = QRotationGate1<std::complex<double>_>::cos(in_RSI,in_XMM0_Qa);
  dVar2 = QRotationGate1<std::complex<double>_>::sin(this_00,__x);
  uVar1 = 0x8000000000000000;
  std::complex<double>::complex(&local_28,__x,-dVar2);
  std::complex<double>::complex(&local_38,0.0,0.0);
  std::complex<double>::complex(&local_48,0.0,0.0);
  dVar2 = QRotationGate1<std::complex<double>_>::cos(this_00,__x_00);
  __i = QRotationGate1<std::complex<double>_>::sin(this_00,dVar2);
  std::complex<double>::complex(&local_58,dVar2,__i);
  m10._M_value._8_8_ = __x;
  m10._M_value._0_8_ = in_stack_ffffffffffffff78;
  m11._M_value._8_8_ = dVar2;
  m11._M_value._0_8_ = this_00;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = uVar1;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m10,m11);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX_00._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using SqMat = qclab::dense::SquareMatrix< T > ;
          return SqMat( T(this->cos(),-this->sin()) , T(0) ,
                        T(0) , T(this->cos(), this->sin()) ) ;
        }